

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint128_t farmhashcc::Fingerprint128(char *s,size_t len)

{
  uint128_t uVar1;
  size_t in_stack_00000028;
  char *in_stack_00000030;
  
  uVar1 = CityHash128(in_stack_00000030,in_stack_00000028);
  return uVar1;
}

Assistant:

uint128_t Fingerprint128(const char* s, size_t len) {
  return CityHash128(s, len);
}